

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

UploadSampleAnalyzeResult
deqp::gles3::Performance::anon_unknown_1::
analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
          (TestLog *log,
          vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
          *samples,bool logBucketPerformance)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pUVar2;
  pointer pfVar3;
  undefined8 uVar4;
  pointer pVVar5;
  deUint64 *pdVar6;
  int *piVar7;
  pointer pUVar8;
  SampleBuilder *pSVar9;
  uint uVar10;
  ulong target;
  long lVar11;
  int endNdx;
  long lVar12;
  size_type __n;
  ulong uVar13;
  pointer pfVar14;
  undefined1 auVar15 [8];
  undefined1 auVar16 [8];
  uint uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  UploadSampleAnalyzeResult UVar23;
  vector<float,_std::allocator<float>_> processingRates;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  size_type __dnew;
  LineParametersWithConfidence contributionFitting;
  ScopedLogSection section_1;
  LineParametersWithConfidence theilSenFitting;
  size_type __dnew_1;
  ScopedLogSection section;
  ScopedLogSection section_2;
  undefined1 local_a78 [12];
  float fStack_a6c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a68;
  string local_a58;
  string local_a38;
  qpSampleValueTag local_a18;
  float local_a14;
  undefined1 local_a10 [8];
  undefined8 local_a08;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a00;
  string local_9f0;
  string local_9d0;
  qpSampleValueTag local_9b0;
  float local_9ac;
  float local_9a4;
  float local_9a0;
  float local_99c;
  LogNumber<float> local_998;
  undefined1 local_930 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_920;
  float local_910;
  float local_90c;
  LogNumber<float> local_908;
  string local_8a0;
  LogNumber<float> local_880;
  LogNumber<float> local_818;
  LineParametersWithConfidence local_7ac;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  LogNumber<float> local_5b0;
  string local_548;
  string local_528;
  float local_508;
  float local_504;
  float local_500;
  float local_4fc;
  float local_4f8;
  float local_4f4;
  float local_4f0;
  float local_4ec;
  float local_4e8;
  float local_4e4;
  LogNumber<float> local_4e0;
  LogNumber<float> local_478;
  LogNumber<float> local_410;
  LogNumber<float> local_3a8;
  LogNumber<float> local_340;
  undefined1 local_2d8 [16];
  string local_2c0;
  ScopedLogSection local_2a0;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
            (&local_7ac,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,1,
             0x20);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a10,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,
             (allocator_type *)local_a78);
  pUVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __n = ((long)(samples->
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar8 >> 3) * 0x6db6db6db6db6db7
  ;
  uVar10 = (uint)__n;
  if (0 < (int)uVar10) {
    pdVar6 = &(pUVar8->duration).fitResponseDuration;
    uVar13 = 0;
    do {
      *(deUint64 *)((long)local_a10 + uVar13 * 8) = *pdVar6;
      uVar13 = uVar13 + 1;
      pdVar6 = pdVar6 + 7;
    } while ((uVar10 & 0x7fffffff) != uVar13);
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_a78,__n,(allocator_type *)&local_998);
  uVar4 = local_a78._0_8_;
  pUVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (int)((long)(samples->
                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar8 >> 3) *
           -0x49249249;
  if (0 < (int)uVar10) {
    piVar7 = &pUVar8->writtenSize;
    uVar13 = 0;
    do {
      *(float *)(local_a78._0_8_ + uVar13 * 4) =
           (float)*piVar7 / (((float)*(ulong *)((long)local_a10 + uVar13 * 8) / 1000.0) / 1000.0);
      uVar13 = uVar13 + 1;
      piVar7 = piVar7 + 0xe;
    } while ((uVar10 & 0x7fffffff) != uVar13);
  }
  pfVar3 = (pointer)CONCAT44(fStack_a6c,local_a78._8_4_);
  pfVar14 = (pointer)local_a78._0_8_;
  if ((pointer)local_a78._0_8_ != pfVar3) {
    uVar13 = (long)pfVar3 - local_a78._0_8_ >> 2;
    lVar11 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a78._0_8_,pfVar3,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar4,pfVar3);
    pfVar14 = (pointer)CONCAT44(fStack_a6c,local_a78._8_4_);
  }
  uVar4 = local_a78._0_8_;
  local_99c = (float)(((long)pfVar14 - local_a78._0_8_ >> 2) - 1) * 0.5;
  fVar18 = floorf(local_99c);
  fVar19 = local_99c - (float)(int)fVar18;
  local_99c = fVar19 * *(float *)(uVar4 + (long)((int)fVar18 + 1) * 4);
  local_148 = ZEXT416((uint)((1.0 - fVar19) * *(float *)(uVar4 + (long)(int)fVar18 * 4)));
  operator_delete((void *)uVar4,local_a68._M_allocated_capacity - uVar4);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_a78,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,
             (allocator_type *)&local_998);
  uVar4 = local_a78._0_8_;
  pUVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (int)((long)(samples->
                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar8 >> 3) *
           -0x49249249;
  if (0 < (int)uVar10) {
    piVar7 = &pUVar8->writtenSize;
    uVar13 = 0;
    do {
      *(float *)(local_a78._0_8_ + uVar13 * 4) =
           (float)*(ulong *)((long)local_a10 + uVar13 * 8) -
           ((float)*piVar7 * local_7ac.coefficient + local_7ac.offset);
      uVar13 = uVar13 + 1;
      piVar7 = piVar7 + 0xe;
    } while ((uVar10 & 0x7fffffff) != uVar13);
  }
  pfVar3 = (pointer)CONCAT44(fStack_a6c,local_a78._8_4_);
  if ((pointer)local_a78._0_8_ != pfVar3) {
    uVar13 = (long)pfVar3 - local_a78._0_8_ >> 2;
    lVar11 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a78._0_8_,pfVar3,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar4,pfVar3);
  }
  operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity - local_a78._0_8_);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_a78,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,
             (allocator_type *)&local_998);
  uVar4 = local_a78._0_8_;
  pUVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (int)((long)(samples->
                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar8 >> 3) *
           -0x49249249;
  if (0 < (int)uVar10) {
    piVar7 = &pUVar8->writtenSize;
    uVar13 = 0;
    do {
      fVar18 = (float)*piVar7 * local_7ac.coefficient + local_7ac.offset;
      fVar19 = 0.0;
      if (1.0 <= fVar18) {
        fVar19 = ((float)*(ulong *)((long)local_a10 + uVar13 * 8) - fVar18) / fVar18;
      }
      *(float *)(local_a78._0_8_ + uVar13 * 4) = fVar19;
      uVar13 = uVar13 + 1;
      piVar7 = piVar7 + 0xe;
    } while ((uVar10 & 0x7fffffff) != uVar13);
  }
  pfVar3 = (pointer)CONCAT44(fStack_a6c,local_a78._8_4_);
  if ((pointer)local_a78._0_8_ != pfVar3) {
    uVar13 = (long)pfVar3 - local_a78._0_8_ >> 2;
    lVar11 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a78._0_8_,pfVar3,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar4,pfVar3);
  }
  operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity - local_a78._0_8_);
  pVVar5 = local_a08;
  auVar15 = local_a10;
  auVar16 = local_a10;
  if (local_a10 != (undefined1  [8])local_a08) {
    uVar13 = (long)local_a08 - (long)local_a10 >> 3;
    lVar11 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a10,local_a08,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (auVar15,pVVar5);
    auVar15 = (undefined1  [8])local_a08;
    auVar16 = local_a10;
  }
  local_4e4 = (float)(((long)auVar15 - (long)auVar16 >> 3) - 1) * 0.5;
  local_48 = floorf(local_4e4);
  uVar13 = *(ulong *)((long)auVar16 + (long)(int)local_48 * 8);
  target = uVar13;
  if ((long)uVar13 < 0) {
    target = (ulong)((uint)uVar13 & 1) | uVar13 >> 1;
  }
  local_90c = (float)uVar13;
  uVar13 = *(ulong *)((long)auVar16 + (long)((int)local_48 + 1) * 8);
  if ((long)uVar13 < 0) {
    target = uVar13 >> 1;
  }
  local_910 = (float)uVar13;
  operator_delete((void *)auVar16,aStack_a00._M_allocated_capacity - (long)auVar16);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>>
            ((SingleOperationStatistics *)local_a10,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
              *)0x0,target);
  local_9a0 = (float)local_a08;
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>>
            ((SingleOperationStatistics *)local_a10,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
              *)0x8,target);
  local_158._0_4_ = (float)local_a08;
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>>
            ((SingleOperationStatistics *)local_a10,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
              *)&DAT_00000010,target);
  local_9a4 = (float)local_a08;
  local_a10 = (undefined1  [8])&aStack_a00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a10,"Samples","");
  local_a78._0_8_ = &local_a68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"Samples","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_2c0,log,(string *)local_a10,(string *)local_a78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  local_340.m_name._M_dataplus._M_p = (pointer)&local_340.m_name.field_2;
  local_340.m_name.field_2._M_allocated_capacity._0_4_ = 0x706d6153;
  local_340.m_name._M_string_length = 7;
  local_340.m_name.field_2._M_allocated_capacity._4_4_ = 0x73656c;
  local_880.m_name._M_dataplus._M_p = (pointer)&local_880.m_name.field_2;
  local_880.m_name.field_2._M_allocated_capacity._0_4_ = 0x706d6153;
  local_880.m_name.field_2._M_local_buf[4] = 'l';
  local_880.m_name.field_2._M_allocated_capacity._5_2_ = 0x7365;
  local_880.m_name._M_string_length = 7;
  local_880.m_name.field_2._M_local_buf[7] = '\0';
  tcu::LogSampleList::LogSampleList((LogSampleList *)&local_478,&local_340.m_name,&local_880.m_name)
  ;
  tcu::TestLog::startSampleList(log,&local_478.m_name,&local_478.m_desc);
  tcu::TestLog::startSampleInfo(log);
  local_3a8.m_name._M_dataplus._M_p = (pointer)&local_3a8.m_name.field_2;
  local_3a8.m_name.field_2._M_allocated_capacity._0_7_ = 0x6e657474697257;
  local_3a8.m_name.field_2._7_4_ = 0x657a6953;
  local_3a8.m_name._M_string_length = 0xb;
  local_3a8.m_name.field_2._M_local_buf[0xb] = '\0';
  local_410.m_name._M_dataplus._M_p = (pointer)&local_410.m_name.field_2;
  local_410.m_name.field_2._M_allocated_capacity = 0x206e657474697257;
  local_410.m_name.field_2._8_4_ = 0x657a6973;
  local_410.m_name._M_string_length = 0xc;
  local_410.m_name.field_2._M_local_buf[0xc] = '\0';
  local_920._M_allocated_capacity._0_4_ = 0x65747962;
  local_920._M_allocated_capacity._4_2_ = 0x73;
  local_930._8_8_ = 5;
  local_930._0_8_ = &local_920;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_a10,&local_3a8.m_name,&local_410.m_name,(string *)local_930,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::TestLog::writeValueInfo(log,(string *)local_a10,&local_9f0,&local_9d0,local_9b0);
  local_8a0.field_2._M_allocated_capacity = 0x6953726566667542;
  local_8a0.field_2._8_2_ = 0x657a;
  local_8a0._M_string_length = 10;
  local_8a0.field_2._M_local_buf[10] = '\0';
  local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
  local_5d0.field_2._M_allocated_capacity._0_7_ = 0x20726566667542;
  local_5d0.field_2._7_4_ = 0x657a6973;
  local_5d0._M_string_length = 0xb;
  local_5d0.field_2._M_local_buf[0xb] = '\0';
  local_528.field_2._M_allocated_capacity._0_4_ = 0x65747962;
  local_528.field_2._M_allocated_capacity._4_2_ = 0x73;
  local_528._M_string_length = 5;
  local_8a0._M_dataplus._M_p = (pointer)&local_8a0.field_2;
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_a78,&local_8a0,&local_5d0,&local_528,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::TestLog::writeValueInfo(log,(string *)local_a78,&local_a58,&local_a38,local_a18);
  local_548.field_2._M_allocated_capacity = 0x6d69546c61746f54;
  local_548.field_2._8_2_ = 0x65;
  local_548._M_string_length = 9;
  local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
  local_5f0.field_2._M_allocated_capacity = 0x6974206c61746f54;
  local_5f0.field_2._8_2_ = 0x656d;
  local_5f0._M_string_length = 10;
  local_5f0.field_2._M_local_buf[10] = '\0';
  local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
  local_610.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_610._M_string_length = 2;
  local_610.field_2._M_local_buf[2] = '\0';
  local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_998,&local_548,&local_5f0,&local_610,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_998.m_name,&local_998.m_desc,&local_998.m_unit,local_998.m_tag);
  local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
  local_630.field_2._M_allocated_capacity._0_4_ = 0x5470614d;
  local_630._M_string_length = 7;
  local_630.field_2._M_allocated_capacity._4_4_ = 0x656d69;
  local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
  local_650.field_2._M_allocated_capacity = 0x656d69742070614d;
  local_650._M_string_length = 8;
  local_650.field_2._M_local_buf[8] = '\0';
  local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
  local_670.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_670._M_string_length = 2;
  local_670.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_818,&local_630,&local_650,&local_670,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_818.m_name,&local_818.m_desc,&local_818.m_unit,local_818.m_tag);
  local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
  local_690.field_2._M_allocated_capacity = 0x6d695470616d6e55;
  local_690.field_2._8_2_ = 0x65;
  local_690._M_string_length = 9;
  local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
  local_6b0.field_2._M_allocated_capacity = 0x69742070616d6e55;
  local_6b0.field_2._8_2_ = 0x656d;
  local_6b0._M_string_length = 10;
  local_6b0.field_2._M_local_buf[10] = '\0';
  local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
  local_6d0.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_6d0._M_string_length = 2;
  local_6d0.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_5b0,&local_690,&local_6b0,&local_6d0,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_5b0.m_name,&local_5b0.m_desc,&local_5b0.m_unit,local_5b0.m_tag);
  local_6f0._M_dataplus._M_p = (pointer)&local_6f0.field_2;
  local_6f0.field_2._M_allocated_capacity = 0x6d69546574697257;
  local_6f0.field_2._8_2_ = 0x65;
  local_6f0._M_string_length = 9;
  local_710._M_dataplus._M_p = (pointer)&local_710.field_2;
  local_710.field_2._M_allocated_capacity = 0x6974206574697257;
  local_710.field_2._8_2_ = 0x656d;
  local_710._M_string_length = 10;
  local_710.field_2._M_local_buf[10] = '\0';
  local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
  local_730.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_730._M_string_length = 2;
  local_730.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_4e0,&local_6f0,&local_710,&local_730,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_4e0.m_name,&local_4e0.m_desc,&local_4e0.m_unit,local_4e0.m_tag);
  local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
  local_750.field_2._M_allocated_capacity._0_7_ = 0x69736552746946;
  local_750.field_2._7_4_ = 0x6c617564;
  local_750._M_string_length = 0xb;
  local_750.field_2._M_local_buf[0xb] = '\0';
  local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
  local_770.field_2._M_allocated_capacity = 0x6973657220746946;
  local_770.field_2._8_4_ = 0x6c617564;
  local_770._M_string_length = 0xc;
  local_770.field_2._M_local_buf[0xc] = '\0';
  local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
  local_790.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_790._M_string_length = 2;
  local_790.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_908,&local_750,&local_770,&local_790,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            (log,&local_908.m_name,&local_908.m_desc,&local_908.m_unit,local_908.m_tag);
  tcu::TestLog::endSampleInfo(log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908.m_unit._M_dataplus._M_p != &local_908.m_unit.field_2) {
    operator_delete(local_908.m_unit._M_dataplus._M_p,
                    local_908.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908.m_desc._M_dataplus._M_p != &local_908.m_desc.field_2) {
    operator_delete(local_908.m_desc._M_dataplus._M_p,
                    local_908.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908.m_name._M_dataplus._M_p != &local_908.m_name.field_2) {
    operator_delete(local_908.m_name._M_dataplus._M_p,
                    CONCAT17(local_908.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_908.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_908.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790._M_dataplus._M_p != &local_790.field_2) {
    operator_delete(local_790._M_dataplus._M_p,
                    CONCAT53(local_790.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_790.field_2._M_local_buf[2],
                                      local_790.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_770._M_dataplus._M_p != &local_770.field_2) {
    operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._M_dataplus._M_p != &local_750.field_2) {
    operator_delete(local_750._M_dataplus._M_p,
                    CONCAT17(local_750.field_2._M_local_buf[7],
                             local_750.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0.m_unit._M_dataplus._M_p != &local_4e0.m_unit.field_2) {
    operator_delete(local_4e0.m_unit._M_dataplus._M_p,
                    local_4e0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0.m_desc._M_dataplus._M_p != &local_4e0.m_desc.field_2) {
    operator_delete(local_4e0.m_desc._M_dataplus._M_p,
                    local_4e0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0.m_name._M_dataplus._M_p != &local_4e0.m_name.field_2) {
    operator_delete(local_4e0.m_name._M_dataplus._M_p,
                    CONCAT53(local_4e0.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_4e0.m_name.field_2._M_local_buf[2],
                                      local_4e0.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730._M_dataplus._M_p != &local_730.field_2) {
    operator_delete(local_730._M_dataplus._M_p,
                    CONCAT53(local_730.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_730.field_2._M_local_buf[2],
                                      local_730.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_710._M_dataplus._M_p != &local_710.field_2) {
    operator_delete(local_710._M_dataplus._M_p,local_710.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
    operator_delete(local_6f0._M_dataplus._M_p,local_6f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0.m_unit._M_dataplus._M_p != &local_5b0.m_unit.field_2) {
    operator_delete(local_5b0.m_unit._M_dataplus._M_p,
                    local_5b0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0.m_desc._M_dataplus._M_p != &local_5b0.m_desc.field_2) {
    operator_delete(local_5b0.m_desc._M_dataplus._M_p,
                    local_5b0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0.m_name._M_dataplus._M_p != &local_5b0.m_name.field_2) {
    operator_delete(local_5b0.m_name._M_dataplus._M_p,
                    local_5b0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
    operator_delete(local_6d0._M_dataplus._M_p,
                    CONCAT53(local_6d0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_6d0.field_2._M_local_buf[2],
                                      local_6d0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
    operator_delete(local_6b0._M_dataplus._M_p,local_6b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690._M_dataplus._M_p != &local_690.field_2) {
    operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818.m_unit._M_dataplus._M_p != &local_818.m_unit.field_2) {
    operator_delete(local_818.m_unit._M_dataplus._M_p,
                    local_818.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818.m_desc._M_dataplus._M_p != &local_818.m_desc.field_2) {
    operator_delete(local_818.m_desc._M_dataplus._M_p,
                    local_818.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818.m_name._M_dataplus._M_p != &local_818.m_name.field_2) {
    operator_delete(local_818.m_name._M_dataplus._M_p,
                    CONCAT17(local_818.m_name.field_2._M_local_buf[7],
                             local_818.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670._M_dataplus._M_p != &local_670.field_2) {
    operator_delete(local_670._M_dataplus._M_p,
                    CONCAT53(local_670.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_670.field_2._M_local_buf[2],
                                      local_670.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650._M_dataplus._M_p != &local_650.field_2) {
    operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_630._M_dataplus._M_p != &local_630.field_2) {
    operator_delete(local_630._M_dataplus._M_p,
                    CONCAT44(local_630.field_2._M_allocated_capacity._4_4_,
                             local_630.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_unit._M_dataplus._M_p != &local_998.m_unit.field_2) {
    operator_delete(local_998.m_unit._M_dataplus._M_p,
                    local_998.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_desc._M_dataplus._M_p != &local_998.m_desc.field_2) {
    operator_delete(local_998.m_desc._M_dataplus._M_p,
                    local_998.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_name._M_dataplus._M_p != &local_998.m_name.field_2) {
    operator_delete(local_998.m_name._M_dataplus._M_p,
                    local_998.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._M_dataplus._M_p != &local_610.field_2) {
    operator_delete(local_610._M_dataplus._M_p,
                    CONCAT53(local_610.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_610.field_2._M_local_buf[2],
                                      local_610.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
    operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != &local_548.field_2) {
    operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,
                    CONCAT26(local_528.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_528.field_2._M_allocated_capacity._4_2_,
                                      local_528.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
    operator_delete(local_5d0._M_dataplus._M_p,
                    CONCAT17(local_5d0.field_2._M_local_buf[7],
                             local_5d0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0._M_dataplus._M_p != &local_8a0.field_2) {
    operator_delete(local_8a0._M_dataplus._M_p,local_8a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_930._0_8_ != &local_920) {
    operator_delete((void *)local_930._0_8_,
                    CONCAT26(local_920._M_allocated_capacity._6_2_,
                             CONCAT24(local_920._M_allocated_capacity._4_2_,
                                      local_920._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410.m_name._M_dataplus._M_p != &local_410.m_name.field_2) {
    operator_delete(local_410.m_name._M_dataplus._M_p,
                    local_410.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8.m_name._M_dataplus._M_p != &local_3a8.m_name.field_2) {
    operator_delete(local_3a8.m_name._M_dataplus._M_p,
                    CONCAT17(local_3a8.m_name.field_2._M_local_buf[7],
                             local_3a8.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478.m_desc._M_dataplus._M_p != &local_478.m_desc.field_2) {
    operator_delete(local_478.m_desc._M_dataplus._M_p,
                    local_478.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478.m_name._M_dataplus._M_p != &local_478.m_name.field_2) {
    operator_delete(local_478.m_name._M_dataplus._M_p,
                    local_478.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_880.m_name._M_dataplus._M_p != &local_880.m_name.field_2) {
    operator_delete(local_880.m_name._M_dataplus._M_p,
                    CONCAT17(local_880.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_880.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_880.m_name.field_2._M_local_buf[4],
                                               local_880.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.m_name._M_dataplus._M_p != &local_340.m_name.field_2) {
    operator_delete(local_340.m_name._M_dataplus._M_p,
                    CONCAT44(local_340.m_name.field_2._M_allocated_capacity._4_4_,
                             local_340.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  pUVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(samples->
                              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar8) >> 3) *
          -0x49249249) {
    lVar12 = 0;
    lVar11 = 0;
    do {
      uVar13 = *(ulong *)((long)&(pUVar8->duration).fitResponseDuration + lVar12);
      local_2d8._0_4_ =
           (float)*(int *)((long)&pUVar8->writtenSize + lVar12) * local_7ac.coefficient +
           local_7ac.offset;
      local_a08 = (pointer)0x0;
      aStack_a00._M_allocated_capacity = 0;
      aStack_a00._8_8_ = 0;
      local_a10 = (undefined1  [8])log;
      pSVar9 = tcu::SampleBuilder::operator<<
                         ((SampleBuilder *)local_a10,*(int *)((long)&pUVar8->writtenSize + lVar12));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&((samples->
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 bufferSize + lVar12));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&(((samples->
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 duration).totalDuration + lVar12));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&(((samples->
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 duration).mapDuration + lVar12));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&(((samples->
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 duration).unmapDuration + lVar12));
      pSVar9 = tcu::SampleBuilder::operator<<
                         (pSVar9,*(int *)((long)&(((samples->
                                                                                                      
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                 duration).writeDuration + lVar12));
      pSVar9 = tcu::SampleBuilder::operator<<(pSVar9,(float)uVar13 - (float)local_2d8._0_4_);
      tcu::SampleBuilder::operator<<(pSVar9,(EndSampleToken *)&tcu::TestLog::EndSample);
      if (local_a08 != (pointer)0x0) {
        operator_delete(local_a08,aStack_a00._8_8_ - (long)local_a08);
      }
      lVar11 = lVar11 + 1;
      pUVar8 = (samples->
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar12 = lVar12 + 0x38;
    } while (lVar11 < (int)((ulong)((long)(samples->
                                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar8
                                   ) >> 3) * -0x49249249);
  }
  tcu::TestLog::endSampleList(log);
  tcu::TestLog::endSection((TestLog *)local_2c0._M_dataplus._M_p);
  local_a10 = (undefined1  [8])&aStack_a00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a10,"Contribution","");
  local_a78._0_8_ = &local_a68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"Contributions","");
  paVar1 = &local_340.m_name.field_2;
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_8a0,log,(string *)local_a10,(string *)local_a78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
            ((LineParametersWithConfidence *)local_930,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,1,0)
  ;
  local_818.m_name._M_dataplus._M_p = (pointer)&local_818.m_name.field_2;
  local_818.m_name.field_2._M_allocated_capacity._0_7_ = 0x736e6f4370614d;
  local_818.m_name.field_2._M_local_buf[7] = 't';
  local_818.m_name.field_2._8_7_ = 0x74736f43746e61;
  local_818.m_name._M_string_length = 0xf;
  local_818.m_name.field_2._M_local_buf[0xf] = '\0';
  local_5b0.m_name._M_dataplus._M_p = (pointer)&local_5b0.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5b0,"Map: Approximated contant cost","");
  local_4e0.m_name._M_dataplus._M_p = (pointer)&local_4e0.m_name.field_2;
  local_4e0.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_4e0.m_name._M_string_length = 2;
  local_4e0.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a10,&local_818.m_name,&local_5b0.m_name,&local_4e0.m_name,
             QP_KEY_TAG_TIME,(float)local_930._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_a10,local_9f0._M_dataplus._M_p,local_9d0._M_dataplus._M_p,local_9b0,
             local_9ac);
  local_908.m_name._M_dataplus._M_p = (pointer)&local_908.m_name.field_2;
  local_908.m_name.field_2._M_allocated_capacity._0_5_ = 0x694c70614d;
  local_908.m_name.field_2._M_allocated_capacity._5_2_ = 0x656e;
  local_908.m_name.field_2._M_local_buf[7] = 'a';
  local_908.m_name.field_2._8_5_ = 0x74736f4372;
  local_908.m_name._M_string_length = 0xd;
  local_908.m_name.field_2._M_local_buf[0xd] = '\0';
  local_478.m_name._M_dataplus._M_p = (pointer)&local_478.m_name.field_2;
  local_998.m_name._M_dataplus._M_p = (char *)0x1d;
  local_478.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_478,(ulong)&local_998);
  local_478.m_name.field_2._M_allocated_capacity = (size_type)local_998.m_name._M_dataplus._M_p;
  builtin_strncpy(local_478.m_name._M_dataplus._M_p,"Map: Approximated linear cost",0x1d);
  local_478.m_name._M_string_length = (size_type)local_998.m_name._M_dataplus._M_p;
  local_478.m_name._M_dataplus._M_p[(long)local_998.m_name._M_dataplus._M_p] = '\0';
  local_340.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_340.m_name._M_string_length = 7;
  local_340.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  local_340.m_name._M_dataplus._M_p = (pointer)paVar1;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_908.m_name,&local_478.m_name,&local_340.m_name,
             QP_KEY_TAG_TIME,(float)local_930._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_a78._0_8_,local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,
             local_a18,local_a14);
  local_880.m_name._M_dataplus._M_p = (pointer)&local_880.m_name.field_2;
  local_880.m_name.field_2._M_allocated_capacity._0_4_ = 0x4d70614d;
  local_880.m_name.field_2._M_local_buf[4] = 'e';
  local_880.m_name.field_2._M_allocated_capacity._5_2_ = 0x6964;
  local_880.m_name.field_2._M_local_buf[7] = 'a';
  local_880.m_name.field_2._8_5_ = 0x74736f436e;
  local_880.m_name._M_string_length = 0xd;
  local_880.m_name.field_2._M_local_buf[0xd] = '\0';
  local_3a8.m_name._M_dataplus._M_p = (pointer)&local_3a8.m_name.field_2;
  local_410.m_name._M_dataplus._M_p = &DAT_00000010;
  local_3a8.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_3a8,(ulong)&local_410);
  local_3a8.m_name.field_2._M_allocated_capacity._0_7_ = SUB87(local_410.m_name._M_dataplus._M_p,0);
  local_3a8.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_410.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_3a8.m_name._M_dataplus._M_p,"Map: Median cost",0x10);
  local_3a8.m_name._M_string_length = (size_type)local_410.m_name._M_dataplus._M_p;
  local_3a8.m_name._M_dataplus._M_p[(long)local_410.m_name._M_dataplus._M_p] = '\0';
  local_410.m_name._M_dataplus._M_p = (pointer)&local_410.m_name.field_2;
  local_410.m_name._M_string_length = 2;
  local_410.m_name.field_2._M_allocated_capacity._0_3_ = 0x7375;
  tcu::LogNumber<float>::LogNumber
            (&local_998,&local_880.m_name,&local_3a8.m_name,&local_410.m_name,QP_KEY_TAG_TIME,
             local_9a0);
  tcu::TestLog::writeFloat
            (log,local_998.m_name._M_dataplus._M_p,local_998.m_desc._M_dataplus._M_p,
             local_998.m_unit._M_dataplus._M_p,local_998.m_tag,local_998.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_unit._M_dataplus._M_p != &local_998.m_unit.field_2) {
    operator_delete(local_998.m_unit._M_dataplus._M_p,
                    local_998.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_desc._M_dataplus._M_p != &local_998.m_desc.field_2) {
    operator_delete(local_998.m_desc._M_dataplus._M_p,
                    local_998.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_name._M_dataplus._M_p != &local_998.m_name.field_2) {
    operator_delete(local_998.m_name._M_dataplus._M_p,
                    local_998.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410.m_name._M_dataplus._M_p != &local_410.m_name.field_2) {
    operator_delete(local_410.m_name._M_dataplus._M_p,
                    local_410.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8.m_name._M_dataplus._M_p != &local_3a8.m_name.field_2) {
    operator_delete(local_3a8.m_name._M_dataplus._M_p,
                    CONCAT17(local_3a8.m_name.field_2._M_local_buf[7],
                             local_3a8.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_880.m_name._M_dataplus._M_p != &local_880.m_name.field_2) {
    operator_delete(local_880.m_name._M_dataplus._M_p,
                    CONCAT17(local_880.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_880.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_880.m_name.field_2._M_local_buf[4],
                                               local_880.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_340.m_name._M_dataplus._M_p,
                    CONCAT44(local_340.m_name.field_2._M_allocated_capacity._4_4_,
                             local_340.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478.m_name._M_dataplus._M_p != &local_478.m_name.field_2) {
    operator_delete(local_478.m_name._M_dataplus._M_p,
                    (ulong)(local_478.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908.m_name._M_dataplus._M_p != &local_908.m_name.field_2) {
    operator_delete(local_908.m_name._M_dataplus._M_p,
                    CONCAT17(local_908.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_908.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_908.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0.m_name._M_dataplus._M_p != &local_4e0.m_name.field_2) {
    operator_delete(local_4e0.m_name._M_dataplus._M_p,
                    CONCAT53(local_4e0.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_4e0.m_name.field_2._M_local_buf[2],
                                      local_4e0.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0.m_name._M_dataplus._M_p != &local_5b0.m_name.field_2) {
    operator_delete(local_5b0.m_name._M_dataplus._M_p,
                    local_5b0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818.m_name._M_dataplus._M_p != &local_818.m_name.field_2) {
    operator_delete(local_818.m_name._M_dataplus._M_p,
                    CONCAT17(local_818.m_name.field_2._M_local_buf[7],
                             local_818.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
            ((LineParametersWithConfidence *)local_930,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,1,8)
  ;
  local_818.m_name._M_dataplus._M_p = (pointer)&local_818.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_818,"UnmapConstantCost","");
  local_5b0.m_name._M_dataplus._M_p = (pointer)&local_5b0.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5b0,"Unmap: Approximated contant cost","");
  local_4e0.m_name._M_dataplus._M_p = (pointer)&local_4e0.m_name.field_2;
  local_4e0.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_4e0.m_name._M_string_length = 2;
  local_4e0.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a10,&local_818.m_name,&local_5b0.m_name,&local_4e0.m_name,
             QP_KEY_TAG_TIME,(float)local_930._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_a10,local_9f0._M_dataplus._M_p,local_9d0._M_dataplus._M_p,local_9b0,
             local_9ac);
  local_908.m_name._M_dataplus._M_p = (pointer)&local_908.m_name.field_2;
  local_908.m_name.field_2._M_allocated_capacity._0_5_ = 0x70616d6e55;
  local_908.m_name.field_2._M_allocated_capacity._5_2_ = 0x694c;
  local_908.m_name.field_2._M_local_buf[7] = 'n';
  local_908.m_name.field_2._8_5_ = 0x6f43726165;
  local_908.m_name.field_2._M_local_buf[0xd] = 's';
  local_908.m_name.field_2._M_local_buf[0xe] = 't';
  local_908.m_name._M_string_length = 0xf;
  local_908.m_name.field_2._M_local_buf[0xf] = '\0';
  local_478.m_name._M_dataplus._M_p = (pointer)&local_478.m_name.field_2;
  local_998.m_name._M_dataplus._M_p = (char *)0x1f;
  local_478.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_478,(ulong)&local_998);
  local_478.m_name.field_2._M_allocated_capacity = (size_type)local_998.m_name._M_dataplus._M_p;
  builtin_strncpy(local_478.m_name._M_dataplus._M_p,"Unmap: Approximated linear cost",0x1f);
  local_478.m_name._M_string_length = (size_type)local_998.m_name._M_dataplus._M_p;
  local_478.m_name._M_dataplus._M_p[(long)local_998.m_name._M_dataplus._M_p] = '\0';
  local_340.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_340.m_name._M_string_length = 7;
  local_340.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  local_340.m_name._M_dataplus._M_p = (pointer)paVar1;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_908.m_name,&local_478.m_name,&local_340.m_name,
             QP_KEY_TAG_TIME,(float)local_930._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_a78._0_8_,local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,
             local_a18,local_a14);
  local_880.m_name._M_dataplus._M_p = (pointer)&local_880.m_name.field_2;
  local_880.m_name.field_2._M_allocated_capacity._0_4_ = 0x616d6e55;
  local_880.m_name.field_2._M_local_buf[4] = 'p';
  local_880.m_name.field_2._M_allocated_capacity._5_2_ = 0x654d;
  local_880.m_name.field_2._M_local_buf[7] = 'd';
  local_880.m_name.field_2._8_5_ = 0x6f436e6169;
  local_880.m_name.field_2._M_local_buf[0xd] = 's';
  local_880.m_name.field_2._M_local_buf[0xe] = 't';
  local_880.m_name._M_string_length = 0xf;
  local_880.m_name.field_2._M_local_buf[0xf] = '\0';
  local_3a8.m_name._M_dataplus._M_p = (pointer)&local_3a8.m_name.field_2;
  local_410.m_name._M_dataplus._M_p = (pointer)0x12;
  local_3a8.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_3a8,(ulong)&local_410);
  local_3a8.m_name.field_2._M_allocated_capacity._0_7_ = SUB87(local_410.m_name._M_dataplus._M_p,0);
  local_3a8.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_410.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_3a8.m_name._M_dataplus._M_p,"Unmap: Median cost",0x12);
  local_3a8.m_name._M_string_length = (size_type)local_410.m_name._M_dataplus._M_p;
  local_3a8.m_name._M_dataplus._M_p[(long)local_410.m_name._M_dataplus._M_p] = '\0';
  local_410.m_name._M_dataplus._M_p = (pointer)&local_410.m_name.field_2;
  local_410.m_name._M_string_length = 2;
  local_410.m_name.field_2._M_allocated_capacity._0_3_ = 0x7375;
  tcu::LogNumber<float>::LogNumber
            (&local_998,&local_880.m_name,&local_3a8.m_name,&local_410.m_name,QP_KEY_TAG_TIME,
             (float)local_158._0_4_);
  tcu::TestLog::writeFloat
            (log,local_998.m_name._M_dataplus._M_p,local_998.m_desc._M_dataplus._M_p,
             local_998.m_unit._M_dataplus._M_p,local_998.m_tag,local_998.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_unit._M_dataplus._M_p != &local_998.m_unit.field_2) {
    operator_delete(local_998.m_unit._M_dataplus._M_p,
                    local_998.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_desc._M_dataplus._M_p != &local_998.m_desc.field_2) {
    operator_delete(local_998.m_desc._M_dataplus._M_p,
                    local_998.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_name._M_dataplus._M_p != &local_998.m_name.field_2) {
    operator_delete(local_998.m_name._M_dataplus._M_p,
                    local_998.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410.m_name._M_dataplus._M_p != &local_410.m_name.field_2) {
    operator_delete(local_410.m_name._M_dataplus._M_p,
                    local_410.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8.m_name._M_dataplus._M_p != &local_3a8.m_name.field_2) {
    operator_delete(local_3a8.m_name._M_dataplus._M_p,
                    CONCAT17(local_3a8.m_name.field_2._M_local_buf[7],
                             local_3a8.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_880.m_name._M_dataplus._M_p != &local_880.m_name.field_2) {
    operator_delete(local_880.m_name._M_dataplus._M_p,
                    CONCAT17(local_880.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_880.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_880.m_name.field_2._M_local_buf[4],
                                               local_880.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_340.m_name._M_dataplus._M_p,
                    CONCAT44(local_340.m_name.field_2._M_allocated_capacity._4_4_,
                             local_340.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478.m_name._M_dataplus._M_p != &local_478.m_name.field_2) {
    operator_delete(local_478.m_name._M_dataplus._M_p,
                    (ulong)(local_478.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908.m_name._M_dataplus._M_p != &local_908.m_name.field_2) {
    operator_delete(local_908.m_name._M_dataplus._M_p,
                    CONCAT17(local_908.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_908.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_908.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0.m_name._M_dataplus._M_p != &local_4e0.m_name.field_2) {
    operator_delete(local_4e0.m_name._M_dataplus._M_p,
                    CONCAT53(local_4e0.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_4e0.m_name.field_2._M_local_buf[2],
                                      local_4e0.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0.m_name._M_dataplus._M_p != &local_5b0.m_name.field_2) {
    operator_delete(local_5b0.m_name._M_dataplus._M_p,
                    local_5b0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818.m_name._M_dataplus._M_p != &local_818.m_name.field_2) {
    operator_delete(local_818.m_name._M_dataplus._M_p,
                    CONCAT17(local_818.m_name.field_2._M_local_buf[7],
                             local_818.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
            ((LineParametersWithConfidence *)local_930,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,1,
             0x10);
  local_818.m_name._M_dataplus._M_p = (pointer)&local_818.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_818,"WriteConstantCost","");
  local_5b0.m_name._M_dataplus._M_p = (pointer)&local_5b0.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5b0,"Write: Approximated contant cost","");
  local_4e0.m_name._M_dataplus._M_p = (pointer)&local_4e0.m_name.field_2;
  local_4e0.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_4e0.m_name._M_string_length = 2;
  local_4e0.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a10,&local_818.m_name,&local_5b0.m_name,&local_4e0.m_name,
             QP_KEY_TAG_TIME,(float)local_930._0_4_);
  tcu::TestLog::writeFloat
            (log,(char *)local_a10,local_9f0._M_dataplus._M_p,local_9d0._M_dataplus._M_p,local_9b0,
             local_9ac);
  local_908.m_name._M_dataplus._M_p = (pointer)&local_908.m_name.field_2;
  local_908.m_name.field_2._M_allocated_capacity._0_5_ = 0x6574697257;
  local_908.m_name.field_2._M_allocated_capacity._5_2_ = 0x694c;
  local_908.m_name.field_2._M_local_buf[7] = 'n';
  local_908.m_name.field_2._8_5_ = 0x6f43726165;
  local_908.m_name.field_2._M_local_buf[0xd] = 's';
  local_908.m_name.field_2._M_local_buf[0xe] = 't';
  local_908.m_name._M_string_length = 0xf;
  local_908.m_name.field_2._M_local_buf[0xf] = '\0';
  local_478.m_name._M_dataplus._M_p = (pointer)&local_478.m_name.field_2;
  local_998.m_name._M_dataplus._M_p = (char *)0x1f;
  local_478.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_478,(ulong)&local_998);
  local_478.m_name.field_2._M_allocated_capacity = (size_type)local_998.m_name._M_dataplus._M_p;
  builtin_strncpy(local_478.m_name._M_dataplus._M_p,"Write: Approximated linear cost",0x1f);
  local_478.m_name._M_string_length = (size_type)local_998.m_name._M_dataplus._M_p;
  local_478.m_name._M_dataplus._M_p[(long)local_998.m_name._M_dataplus._M_p] = '\0';
  local_340.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_340.m_name._M_string_length = 7;
  local_340.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  local_340.m_name._M_dataplus._M_p = (pointer)paVar1;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_908.m_name,&local_478.m_name,&local_340.m_name,
             QP_KEY_TAG_TIME,(float)local_930._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,(char *)local_a78._0_8_,local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,
             local_a18,local_a14);
  local_880.m_name._M_dataplus._M_p = (pointer)&local_880.m_name.field_2;
  local_880.m_name.field_2._M_allocated_capacity._0_4_ = 0x74697257;
  local_880.m_name.field_2._M_local_buf[4] = 'e';
  local_880.m_name.field_2._M_allocated_capacity._5_2_ = 0x654d;
  local_880.m_name.field_2._M_local_buf[7] = 'd';
  local_880.m_name.field_2._8_5_ = 0x6f436e6169;
  local_880.m_name.field_2._M_local_buf[0xd] = 's';
  local_880.m_name.field_2._M_local_buf[0xe] = 't';
  local_880.m_name._M_string_length = 0xf;
  local_880.m_name.field_2._M_local_buf[0xf] = '\0';
  local_3a8.m_name._M_dataplus._M_p = (pointer)&local_3a8.m_name.field_2;
  local_410.m_name._M_dataplus._M_p = (pointer)0x12;
  local_3a8.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_3a8,(ulong)&local_410);
  local_3a8.m_name.field_2._M_allocated_capacity._0_7_ = SUB87(local_410.m_name._M_dataplus._M_p,0);
  local_3a8.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_410.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_3a8.m_name._M_dataplus._M_p,"Write: Median cost",0x12);
  local_3a8.m_name._M_string_length = (size_type)local_410.m_name._M_dataplus._M_p;
  local_3a8.m_name._M_dataplus._M_p[(long)local_410.m_name._M_dataplus._M_p] = '\0';
  local_410.m_name._M_dataplus._M_p = (pointer)&local_410.m_name.field_2;
  local_410.m_name._M_string_length = 2;
  local_410.m_name.field_2._M_allocated_capacity._0_3_ = 0x7375;
  tcu::LogNumber<float>::LogNumber
            (&local_998,&local_880.m_name,&local_3a8.m_name,&local_410.m_name,QP_KEY_TAG_TIME,
             local_9a4);
  tcu::TestLog::writeFloat
            (log,local_998.m_name._M_dataplus._M_p,local_998.m_desc._M_dataplus._M_p,
             local_998.m_unit._M_dataplus._M_p,local_998.m_tag,local_998.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_unit._M_dataplus._M_p != &local_998.m_unit.field_2) {
    operator_delete(local_998.m_unit._M_dataplus._M_p,
                    local_998.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_desc._M_dataplus._M_p != &local_998.m_desc.field_2) {
    operator_delete(local_998.m_desc._M_dataplus._M_p,
                    local_998.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_name._M_dataplus._M_p != &local_998.m_name.field_2) {
    operator_delete(local_998.m_name._M_dataplus._M_p,
                    local_998.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410.m_name._M_dataplus._M_p != &local_410.m_name.field_2) {
    operator_delete(local_410.m_name._M_dataplus._M_p,
                    local_410.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8.m_name._M_dataplus._M_p != &local_3a8.m_name.field_2) {
    operator_delete(local_3a8.m_name._M_dataplus._M_p,
                    CONCAT17(local_3a8.m_name.field_2._M_local_buf[7],
                             local_3a8.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_880.m_name._M_dataplus._M_p != &local_880.m_name.field_2) {
    operator_delete(local_880.m_name._M_dataplus._M_p,
                    CONCAT17(local_880.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_880.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_880.m_name.field_2._M_local_buf[4],
                                               local_880.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_340.m_name._M_dataplus._M_p,
                    CONCAT44(local_340.m_name.field_2._M_allocated_capacity._4_4_,
                             local_340.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478.m_name._M_dataplus._M_p != &local_478.m_name.field_2) {
    operator_delete(local_478.m_name._M_dataplus._M_p,
                    (ulong)(local_478.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908.m_name._M_dataplus._M_p != &local_908.m_name.field_2) {
    operator_delete(local_908.m_name._M_dataplus._M_p,
                    CONCAT17(local_908.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_908.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_908.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0.m_name._M_dataplus._M_p != &local_4e0.m_name.field_2) {
    operator_delete(local_4e0.m_name._M_dataplus._M_p,
                    CONCAT53(local_4e0.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_4e0.m_name.field_2._M_local_buf[2],
                                      local_4e0.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0.m_name._M_dataplus._M_p != &local_5b0.m_name.field_2) {
    operator_delete(local_5b0.m_name._M_dataplus._M_p,
                    local_5b0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818.m_name._M_dataplus._M_p != &local_818.m_name.field_2) {
    operator_delete(local_818.m_name._M_dataplus._M_p,
                    CONCAT17(local_818.m_name.field_2._M_local_buf[7],
                             local_818.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  tcu::TestLog::endSection((TestLog *)local_8a0._M_dataplus._M_p);
  local_a10 = (undefined1  [8])&aStack_a00;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a10,"Results","");
  local_a78._0_8_ = &local_a68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"Results","");
  tcu::ScopedLogSection::ScopedLogSection(&local_2a0,log,(string *)local_a10,(string *)local_a78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  pUVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pUVar2 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar19 = (float)((pUVar2[-1].bufferSize + pUVar8->bufferSize) / 2);
  local_508 = local_7ac.coefficient * fVar19;
  local_504 = local_7ac.offset + local_508;
  endNdx = ((int)((ulong)((long)pUVar2 - (long)pUVar8) >> 3) * -0x49249249) / 2;
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
            ((LineParametersWithConfidence *)local_a10,samples,0,endNdx,1,0x20);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
            ((LineParametersWithConfidence *)local_a78,samples,endNdx,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,1,
             0x20);
  pUVar8 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pUVar2 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar18 = (float)pUVar8->writtenSize;
  local_9a0 = (float)pUVar2[-1].writtenSize;
  local_2d8._0_4_ = fVar18;
  local_4ec = (float)local_a10._0_4_;
  local_158 = ZEXT416((uint)local_a08._4_4_);
  local_4e8 = (float)local_a78._0_4_;
  local_58 = ZEXT416((uint)fStack_a6c);
  local_9a4 = getAreaBetweenLines(fVar18,local_9a0,(float)local_a10._0_4_,local_a08._4_4_,
                                  (float)local_a78._0_4_,fStack_a6c);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
            ((LineParametersWithConfidence *)local_a10,samples,0,
             (int)((ulong)((long)pUVar2 - (long)pUVar8) >> 3) * -0x49249249,2,0x20);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>
            ((LineParametersWithConfidence *)local_a78,samples,1,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,2,
             0x20);
  local_4f0 = (float)((samples->
                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                      )._M_impl.super__Vector_impl_data._M_start)->writtenSize;
  local_4f4 = (float)(samples->
                     super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeDurationNoAlloc>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish[-1].writtenSize;
  local_500 = (float)local_a10._0_4_;
  local_68 = ZEXT416((uint)local_a08._4_4_);
  local_4fc = (float)local_a78._0_4_;
  local_78 = ZEXT416((uint)fStack_a6c);
  local_4f8 = getAreaBetweenLines(local_4f0,local_4f4,(float)local_a10._0_4_,local_a08._4_4_,
                                  (float)local_a78._0_4_,fStack_a6c);
  local_930._0_8_ = &local_920;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_930,"ResultLinearity","");
  local_8a0._M_dataplus._M_p = (pointer)&local_8a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8a0,"Sample linearity","");
  local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d0,"%","");
  fVar18 = (float)local_158._0_4_ * (float)local_2d8._0_4_ + local_4ec;
  fVar20 = (float)local_58._0_4_ * (float)local_2d8._0_4_ + local_4e8;
  uVar10 = -(uint)(fVar18 <= fVar20);
  fVar21 = (float)local_158._0_4_ * local_9a0 + local_4ec;
  fVar22 = (float)local_58._0_4_ * local_9a0 + local_4e8;
  uVar17 = -(uint)(fVar22 <= fVar21);
  fVar18 = ((float)(~uVar17 & (uint)fVar22 | (uint)fVar21 & uVar17) -
           (float)(~uVar10 & (uint)fVar20 | (uint)fVar18 & uVar10)) *
           (local_9a0 - (float)local_2d8._0_4_);
  fVar20 = (float)(~-(uint)(fVar18 < 1e-06) & (uint)(1.0 - local_9a4 / fVar18));
  fVar18 = 1.0;
  if (fVar20 <= 1.0) {
    fVar18 = fVar20;
  }
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a10,(string *)local_930,&local_8a0,&local_5d0,
             QP_KEY_TAG_QUALITY,(float)(~-(uint)(fVar20 < 0.0) & (uint)(fVar18 * 100.0)));
  tcu::TestLog::writeFloat
            (log,(char *)local_a10,local_9f0._M_dataplus._M_p,local_9d0._M_dataplus._M_p,local_9b0,
             local_9ac);
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"SampleTemporalStability","")
  ;
  local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_548,"Sample temporal stability","");
  local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f0,"%","");
  fVar18 = (float)local_68._0_4_ * local_4f0 + local_500;
  fVar20 = (float)local_78._0_4_ * local_4f0 + local_4fc;
  uVar10 = -(uint)(fVar18 <= fVar20);
  fVar21 = (float)local_68._0_4_ * local_4f4 + local_500;
  fVar22 = (float)local_78._0_4_ * local_4f4 + local_4fc;
  uVar17 = -(uint)(fVar22 <= fVar21);
  fVar18 = ((float)(~uVar17 & (uint)fVar22 | (uint)fVar21 & uVar17) -
           (float)(~uVar10 & (uint)fVar20 | (uint)fVar18 & uVar10)) * (local_4f4 - local_4f0);
  fVar20 = (float)(~-(uint)(fVar18 < 1e-06) & (uint)(1.0 - local_4f8 / fVar18));
  fVar18 = 1.0;
  if (fVar20 <= 1.0) {
    fVar18 = fVar20;
  }
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_528,&local_548,&local_5f0,QP_KEY_TAG_QUALITY,
             (float)(~-(uint)(fVar20 < 0.0) & (uint)(fVar18 * 100.0)));
  tcu::TestLog::writeFloat
            (log,(char *)local_a78._0_8_,local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,
             local_a18,local_a14);
  local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_610,"ApproximatedConstantCost","");
  local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_630,"Approximated contant cost","");
  local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_650,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_998,&local_610,&local_630,&local_650,QP_KEY_TAG_TIME,local_7ac.offset);
  tcu::TestLog::writeFloat
            (log,local_998.m_name._M_dataplus._M_p,local_998.m_desc._M_dataplus._M_p,
             local_998.m_unit._M_dataplus._M_p,local_998.m_tag,local_998.m_value);
  local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_670,"ApproximatedConstantCostConfidence60Lower","");
  local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_690,"Approximated contant cost 60% confidence lower limit","");
  local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6b0,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_818,&local_670,&local_690,&local_6b0,QP_KEY_TAG_TIME,
             local_7ac.offsetConfidenceLower);
  tcu::TestLog::writeFloat
            (log,local_818.m_name._M_dataplus._M_p,local_818.m_desc._M_dataplus._M_p,
             local_818.m_unit._M_dataplus._M_p,local_818.m_tag,local_818.m_value);
  local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6d0,"ApproximatedConstantCostConfidence60Upper","");
  local_6f0._M_dataplus._M_p = (pointer)&local_6f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6f0,"Approximated contant cost 60% confidence upper limit","");
  local_710._M_dataplus._M_p = (pointer)&local_710.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_710,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_5b0,&local_6d0,&local_6f0,&local_710,QP_KEY_TAG_TIME,
             local_7ac.offsetConfidenceUpper);
  tcu::TestLog::writeFloat
            (log,local_5b0.m_name._M_dataplus._M_p,local_5b0.m_desc._M_dataplus._M_p,
             local_5b0.m_unit._M_dataplus._M_p,local_5b0.m_tag,local_5b0.m_value);
  local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_730,"ApproximatedLinearCost","");
  local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_750,"Approximated linear cost","");
  local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_4e0,&local_730,&local_750,&local_770,QP_KEY_TAG_TIME,
             local_7ac.coefficient * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_4e0.m_name._M_dataplus._M_p,local_4e0.m_desc._M_dataplus._M_p,
             local_4e0.m_unit._M_dataplus._M_p,local_4e0.m_tag,local_4e0.m_value);
  local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_790,"ApproximatedLinearCostConfidence60Lower","");
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2c0,"Approximated linear cost 60% confidence lower limit","");
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_908,&local_790,&local_2c0,&local_178,QP_KEY_TAG_TIME,
             local_7ac.coefficientConfidenceLower * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_908.m_name._M_dataplus._M_p,local_908.m_desc._M_dataplus._M_p,
             local_908.m_unit._M_dataplus._M_p,local_908.m_tag,local_908.m_value);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_198,"ApproximatedLinearCostConfidence60Upper","");
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b8,"Approximated linear cost 60% confidence upper limit","");
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_478,&local_198,&local_1b8,&local_1d8,QP_KEY_TAG_TIME,
             local_7ac.coefficientConfidenceUpper * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            (log,local_478.m_name._M_dataplus._M_p,local_478.m_desc._M_dataplus._M_p,
             local_478.m_unit._M_dataplus._M_p,local_478.m_tag,local_478.m_value);
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f8,"ApproximatedTransferRate","");
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_218,"Approximated transfer rate","");
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"MB / s","");
  fVar18 = fVar19 / ((local_504 / 1000.0) / 1000.0);
  local_2d8 = ZEXT416((uint)fVar18);
  tcu::LogNumber<float>::LogNumber
            (&local_340,&local_1f8,&local_218,&local_238,QP_KEY_TAG_PERFORMANCE,
             fVar18 * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_340.m_name._M_dataplus._M_p,local_340.m_desc._M_dataplus._M_p,
             local_340.m_unit._M_dataplus._M_p,local_340.m_tag,local_340.m_value);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_258,"ApproximatedTransferRateNoConstant","");
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_278,"Approximated transfer rate without constant cost","");
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"MB / s","");
  tcu::LogNumber<float>::LogNumber
            (&local_880,&local_258,&local_278,&local_298,QP_KEY_TAG_PERFORMANCE,
             (fVar19 / ((local_508 / 1000.0) / 1000.0)) * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_880.m_name._M_dataplus._M_p,local_880.m_desc._M_dataplus._M_p,
             local_880.m_unit._M_dataplus._M_p,local_880.m_tag,local_880.m_value);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"SampleMedianTime","");
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Median sample time","");
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_3a8,&local_98,&local_b8,&local_d8,QP_KEY_TAG_TIME,
             (local_4e4 - (float)(int)local_48) * local_910 +
             local_90c * (1.0 - (local_4e4 - (float)(int)local_48)));
  tcu::TestLog::writeFloat
            (log,local_3a8.m_name._M_dataplus._M_p,local_3a8.m_desc._M_dataplus._M_p,
             local_3a8.m_unit._M_dataplus._M_p,local_3a8.m_tag,local_3a8.m_value);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"SampleMedianTransfer","");
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"Median transfer rate","");
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"MB / s","");
  local_148._0_4_ = (float)local_148._0_4_ + local_99c;
  fVar18 = 0.0009765625;
  tcu::LogNumber<float>::LogNumber
            (&local_410,&local_f8,&local_118,&local_138,QP_KEY_TAG_PERFORMANCE,
             (float)local_148._0_4_ * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            (log,local_410.m_name._M_dataplus._M_p,local_410.m_desc._M_dataplus._M_p,
             local_410.m_unit._M_dataplus._M_p,local_410.m_tag,local_410.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410.m_unit._M_dataplus._M_p != &local_410.m_unit.field_2) {
    operator_delete(local_410.m_unit._M_dataplus._M_p,
                    local_410.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410.m_desc._M_dataplus._M_p != &local_410.m_desc.field_2) {
    operator_delete(local_410.m_desc._M_dataplus._M_p,
                    local_410.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410.m_name._M_dataplus._M_p != &local_410.m_name.field_2) {
    operator_delete(local_410.m_name._M_dataplus._M_p,
                    local_410.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8.m_unit._M_dataplus._M_p != &local_3a8.m_unit.field_2) {
    operator_delete(local_3a8.m_unit._M_dataplus._M_p,
                    local_3a8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8.m_desc._M_dataplus._M_p != &local_3a8.m_desc.field_2) {
    operator_delete(local_3a8.m_desc._M_dataplus._M_p,
                    local_3a8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8.m_name._M_dataplus._M_p != &local_3a8.m_name.field_2) {
    operator_delete(local_3a8.m_name._M_dataplus._M_p,
                    CONCAT17(local_3a8.m_name.field_2._M_local_buf[7],
                             local_3a8.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_880.m_unit._M_dataplus._M_p != &local_880.m_unit.field_2) {
    operator_delete(local_880.m_unit._M_dataplus._M_p,
                    local_880.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_880.m_desc._M_dataplus._M_p != &local_880.m_desc.field_2) {
    operator_delete(local_880.m_desc._M_dataplus._M_p,
                    local_880.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_880.m_name._M_dataplus._M_p != &local_880.m_name.field_2) {
    operator_delete(local_880.m_name._M_dataplus._M_p,
                    CONCAT17(local_880.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_880.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_880.m_name.field_2._M_local_buf[4],
                                               local_880.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.m_unit._M_dataplus._M_p != &local_340.m_unit.field_2) {
    operator_delete(local_340.m_unit._M_dataplus._M_p,
                    local_340.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.m_desc._M_dataplus._M_p != &local_340.m_desc.field_2) {
    operator_delete(local_340.m_desc._M_dataplus._M_p,
                    local_340.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340.m_name._M_dataplus._M_p != &local_340.m_name.field_2) {
    operator_delete(local_340.m_name._M_dataplus._M_p,
                    CONCAT44(local_340.m_name.field_2._M_allocated_capacity._4_4_,
                             local_340.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478.m_unit._M_dataplus._M_p != &local_478.m_unit.field_2) {
    operator_delete(local_478.m_unit._M_dataplus._M_p,
                    local_478.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478.m_desc._M_dataplus._M_p != &local_478.m_desc.field_2) {
    operator_delete(local_478.m_desc._M_dataplus._M_p,
                    local_478.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478.m_name._M_dataplus._M_p != &local_478.m_name.field_2) {
    operator_delete(local_478.m_name._M_dataplus._M_p,
                    (ulong)(local_478.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908.m_unit._M_dataplus._M_p != &local_908.m_unit.field_2) {
    operator_delete(local_908.m_unit._M_dataplus._M_p,
                    local_908.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908.m_desc._M_dataplus._M_p != &local_908.m_desc.field_2) {
    operator_delete(local_908.m_desc._M_dataplus._M_p,
                    local_908.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908.m_name._M_dataplus._M_p != &local_908.m_name.field_2) {
    operator_delete(local_908.m_name._M_dataplus._M_p,
                    CONCAT17(local_908.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_908.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_908.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_790._M_dataplus._M_p != &local_790.field_2) {
    operator_delete(local_790._M_dataplus._M_p,
                    CONCAT53(local_790.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_790.field_2._M_local_buf[2],
                                      local_790.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0.m_unit._M_dataplus._M_p != &local_4e0.m_unit.field_2) {
    operator_delete(local_4e0.m_unit._M_dataplus._M_p,
                    local_4e0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0.m_desc._M_dataplus._M_p != &local_4e0.m_desc.field_2) {
    operator_delete(local_4e0.m_desc._M_dataplus._M_p,
                    local_4e0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0.m_name._M_dataplus._M_p != &local_4e0.m_name.field_2) {
    operator_delete(local_4e0.m_name._M_dataplus._M_p,
                    CONCAT53(local_4e0.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_4e0.m_name.field_2._M_local_buf[2],
                                      local_4e0.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_770._M_dataplus._M_p != &local_770.field_2) {
    operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._M_dataplus._M_p != &local_750.field_2) {
    operator_delete(local_750._M_dataplus._M_p,
                    CONCAT17(local_750.field_2._M_local_buf[7],
                             local_750.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730._M_dataplus._M_p != &local_730.field_2) {
    operator_delete(local_730._M_dataplus._M_p,
                    CONCAT53(local_730.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_730.field_2._M_local_buf[2],
                                      local_730.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0.m_unit._M_dataplus._M_p != &local_5b0.m_unit.field_2) {
    operator_delete(local_5b0.m_unit._M_dataplus._M_p,
                    local_5b0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0.m_desc._M_dataplus._M_p != &local_5b0.m_desc.field_2) {
    operator_delete(local_5b0.m_desc._M_dataplus._M_p,
                    local_5b0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0.m_name._M_dataplus._M_p != &local_5b0.m_name.field_2) {
    operator_delete(local_5b0.m_name._M_dataplus._M_p,
                    local_5b0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_710._M_dataplus._M_p != &local_710.field_2) {
    operator_delete(local_710._M_dataplus._M_p,local_710.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
    operator_delete(local_6f0._M_dataplus._M_p,local_6f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
    operator_delete(local_6d0._M_dataplus._M_p,
                    CONCAT53(local_6d0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_6d0.field_2._M_local_buf[2],
                                      local_6d0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818.m_unit._M_dataplus._M_p != &local_818.m_unit.field_2) {
    operator_delete(local_818.m_unit._M_dataplus._M_p,
                    local_818.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818.m_desc._M_dataplus._M_p != &local_818.m_desc.field_2) {
    operator_delete(local_818.m_desc._M_dataplus._M_p,
                    local_818.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818.m_name._M_dataplus._M_p != &local_818.m_name.field_2) {
    operator_delete(local_818.m_name._M_dataplus._M_p,
                    CONCAT17(local_818.m_name.field_2._M_local_buf[7],
                             local_818.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
    operator_delete(local_6b0._M_dataplus._M_p,local_6b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690._M_dataplus._M_p != &local_690.field_2) {
    operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670._M_dataplus._M_p != &local_670.field_2) {
    operator_delete(local_670._M_dataplus._M_p,
                    CONCAT53(local_670.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_670.field_2._M_local_buf[2],
                                      local_670.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_unit._M_dataplus._M_p != &local_998.m_unit.field_2) {
    operator_delete(local_998.m_unit._M_dataplus._M_p,
                    local_998.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_desc._M_dataplus._M_p != &local_998.m_desc.field_2) {
    operator_delete(local_998.m_desc._M_dataplus._M_p,
                    local_998.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_998.m_name._M_dataplus._M_p != &local_998.m_name.field_2) {
    operator_delete(local_998.m_name._M_dataplus._M_p,
                    local_998.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650._M_dataplus._M_p != &local_650.field_2) {
    operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_630._M_dataplus._M_p != &local_630.field_2) {
    operator_delete(local_630._M_dataplus._M_p,
                    CONCAT44(local_630.field_2._M_allocated_capacity._4_4_,
                             local_630.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._M_dataplus._M_p != &local_610.field_2) {
    operator_delete(local_610._M_dataplus._M_p,
                    CONCAT53(local_610.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_610.field_2._M_local_buf[2],
                                      local_610.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &local_a68) {
    operator_delete((void *)local_a78._0_8_,local_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
    operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_548._M_dataplus._M_p != &local_548.field_2) {
    operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,
                    CONCAT26(local_528.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_528.field_2._M_allocated_capacity._4_2_,
                                      local_528.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
    operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
    operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
  }
  if (local_a10 != (undefined1  [8])&aStack_a00) {
    operator_delete((void *)local_a10,aStack_a00._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
    operator_delete(local_5d0._M_dataplus._M_p,
                    CONCAT17(local_5d0.field_2._M_local_buf[7],
                             local_5d0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0._M_dataplus._M_p != &local_8a0.field_2) {
    operator_delete(local_8a0._M_dataplus._M_p,local_8a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_930._0_8_ != &local_920) {
    operator_delete((void *)local_930._0_8_,
                    CONCAT26(local_920._M_allocated_capacity._6_2_,
                             CONCAT24(local_920._M_allocated_capacity._4_2_,
                                      local_920._M_allocated_capacity._0_4_)) + 1);
  }
  tcu::TestLog::endSection(local_2a0.m_log);
  UVar23.transferRateAtRange = (float)local_2d8._0_4_;
  UVar23.transferRateMedian = (float)local_148._0_4_;
  UVar23.transferRateAtInfinity = fVar18;
  return UVar23;
}

Assistant:

static UploadSampleAnalyzeResult analyzeSampleResults (tcu::TestLog& log, const std::vector<UploadSampleResult<SampleType> >& samples, bool logBucketPerformance)
{
	// Assume data is linear with some outliers, fit a line
	const LineParametersWithConfidence						theilSenFitting						= fitLineToSamples(samples);
	const typename SampleTypeTraits<SampleType>::StatsType	resultStats							= calculateSampleStatistics(theilSenFitting, samples);
	float													approximatedTransferRate;
	float													approximatedTransferRateNoConstant;

	// Output raw samples
	{
		const tcu::ScopedLogSection	section(log, "Samples", "Samples");
		logSampleList(log, theilSenFitting, samples);
	}

	// Calculate results for different ranges
	if (logBucketPerformance)
	{
		const int										numBuckets				= 4;
		int												minBufferSize			= 0;
		int												maxBufferSize			= 0;
		std::vector<UploadSampleResult<SampleType> >	buckets[numBuckets];

		bucketizeSamplesUniformly(samples, &buckets[0], numBuckets, minBufferSize, maxBufferSize);

		for (int bucketNdx = 0; bucketNdx < numBuckets; ++bucketNdx)
		{
			if (buckets[bucketNdx].empty())
				continue;

			// Print a nice result summary

			const int												bucketRangeMin	= minBufferSize + (int)(((float) bucketNdx    / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const int												bucketRangeMax	= minBufferSize + (int)(((float)(bucketNdx+1) / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const typename SampleTypeTraits<SampleType>::StatsType	stats			= calculateSampleStatistics(theilSenFitting, buckets[bucketNdx]);
			const tcu::ScopedLogSection								section			(log, "BufferSizeRange", std::string("Transfer performance with buffer size in range [").append(getHumanReadableByteSize(bucketRangeMin).append(", ").append(getHumanReadableByteSize(bucketRangeMax).append("]"))));

			logMapRangeStats<SampleType>(log, stats);
			logUnmapStats<SampleType>(log, stats);
			logWriteStats<SampleType>(log, stats);
			logFlushStats<SampleType>(log, stats);
			logAllocStats<SampleType>(log, stats);

			log	<< tcu::TestLog::Float("Min", "Total: Min time", "us", QP_KEY_TAG_TIME, stats.result.minTime)
				<< tcu::TestLog::Float("Max", "Total: Max time", "us", QP_KEY_TAG_TIME, stats.result.maxTime)
				<< tcu::TestLog::Float("Min90", "Total: 90%-Min time", "us", QP_KEY_TAG_TIME, stats.result.min2DecileTime)
				<< tcu::TestLog::Float("Max90", "Total: 90%-Max time", "us", QP_KEY_TAG_TIME, stats.result.max9DecileTime)
				<< tcu::TestLog::Float("Median", "Total: Median time", "us", QP_KEY_TAG_TIME, stats.result.medianTime)
				<< tcu::TestLog::Float("MedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, stats.medianRate / 1024.0f / 1024.0f)
				<< tcu::TestLog::Float("MaxDiff", "Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiffTime)
				<< tcu::TestLog::Float("Max90Diff", "90%-Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiff9DecileTime)
				<< tcu::TestLog::Float("MedianDiff", "Median difference to approximated", "us", QP_KEY_TAG_TIME, stats.medianDiffTime)
				<< tcu::TestLog::Float("MaxRelDiff", "Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.maxRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("Max90RelDiff", "90%-Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.max9DecileRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("MedianRelDiff", "Median relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.medianRelDiffTime * 100.0f);
		}
	}

	// Contributions
	if (SampleTypeTraits<SampleType>::LOG_CONTRIBUTIONS)
	{
		const tcu::ScopedLogSection	section(log, "Contribution", "Contributions");

		logMapContribution(log, samples, resultStats);
		logUnmapContribution(log, samples, resultStats);
		logWriteContribution(log, samples, resultStats);
		logFlushContribution(log, samples, resultStats);
		logAllocContribution(log, samples, resultStats);
	}

	// Print results
	{
		const tcu::ScopedLogSection	section(log, "Results", "Results");

		const int	medianBufferSize					= (samples.front().bufferSize + samples.back().bufferSize) / 2;
		const float	approximatedTransferTime			= (theilSenFitting.offset + theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	approximatedTransferTimeNoConstant	= (theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	sampleLinearity						= calculateSampleFitLinearity(samples);
		const float	sampleTemporalStability				= calculateSampleTemporalStability(samples);

		approximatedTransferRateNoConstant				= (float)medianBufferSize / approximatedTransferTimeNoConstant;
		approximatedTransferRate						= (float)medianBufferSize / approximatedTransferTime;

		log	<< tcu::TestLog::Float("ResultLinearity", "Sample linearity", "%", QP_KEY_TAG_QUALITY, sampleLinearity * 100.0f)
			<< tcu::TestLog::Float("SampleTemporalStability", "Sample temporal stability", "%", QP_KEY_TAG_QUALITY, sampleTemporalStability * 100.0f)
			<< tcu::TestLog::Float("ApproximatedConstantCost", "Approximated contant cost", "us", QP_KEY_TAG_TIME, theilSenFitting.offset)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Lower", "Approximated contant cost 60% confidence lower limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceLower)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Upper", "Approximated contant cost 60% confidence upper limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceUpper)
			<< tcu::TestLog::Float("ApproximatedLinearCost", "Approximated linear cost", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficient * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Lower", "Approximated linear cost 60% confidence lower limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceLower * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Upper", "Approximated linear cost 60% confidence upper limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceUpper * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRate", "Approximated transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRate / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRateNoConstant", "Approximated transfer rate without constant cost", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRateNoConstant / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("SampleMedianTime", "Median sample time", "us", QP_KEY_TAG_TIME, resultStats.result.medianTime)
			<< tcu::TestLog::Float("SampleMedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, resultStats.medianRate / 1024.0f / 1024.0f);
	}

	// return approximated transfer rate
	{
		UploadSampleAnalyzeResult result;

		result.transferRateMedian = resultStats.medianRate;
		result.transferRateAtRange = approximatedTransferRate;
		result.transferRateAtInfinity = approximatedTransferRateNoConstant;

		return result;
	}
}